

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O3

bool __thiscall deqp::UniformBlockCase::render(UniformBlockCase *this,ShaderProgram *program)

{
  RenderContext *context;
  ulong uVar1;
  undefined8 *puVar2;
  UniformBlockCase *pUVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  int *piVar7;
  undefined8 *__n;
  void *__buf;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  Surface pixels;
  deUint16 indices [6];
  float position [16];
  Random rnd;
  Surface local_288;
  int local_268;
  int local_264;
  undefined1 local_260 [8];
  void *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  int local_238;
  TextureFormat local_230;
  ShaderProgram *local_228;
  UniformBlockCase *local_220;
  undefined8 local_218;
  undefined4 local_210;
  string local_208;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  int local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  ChannelOrder local_180;
  string *local_178;
  ios_base local_148 [264];
  deRandom local_40;
  long lVar6;
  undefined4 extraout_var_00;
  
  __n = (undefined8 *)&local_288;
  local_230 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_228 = program;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar5);
  local_220 = this;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar7 = (int *)CONCAT44(extraout_var_00,iVar4);
  iVar4 = *piVar7;
  iVar8 = 0x80;
  if (iVar4 < 0x80) {
    iVar8 = iVar4;
  }
  iVar9 = 0x80;
  if (piVar7[1] < 0x80) {
    iVar9 = piVar7[1];
  }
  dVar5 = deRandom_getUint32(&local_40);
  uVar10 = (ulong)dVar5 % (ulong)((iVar4 - iVar8) + 1);
  iVar4 = piVar7[1];
  dVar5 = deRandom_getUint32(&local_40);
  uVar1 = (ulong)dVar5 % (ulong)((iVar4 - iVar9) + 1);
  local_1d8 = 0x3f8000003f800000;
  uStack_1d0 = 0x3f80000000000000;
  local_1e8 = 0xbf8000003f800000;
  uStack_1e0 = 0x3f80000000000000;
  local_208.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_208.field_2._8_8_ = 0x3f80000000000000;
  local_208._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_208._M_string_length._0_4_ = 0;
  local_208._M_string_length._4_4_ = 0x3f800000;
  local_218 = 0x2000200010000;
  local_210 = 0x30001;
  iVar4 = (int)uVar10;
  local_264 = (int)uVar1;
  (**(code **)(lVar6 + 0x1a00))(uVar10,uVar1,iVar8,iVar9);
  puVar2 = &local_288.m_pixels.m_cap;
  local_288._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"a_position","");
  local_260._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_258 = (void *)((long)&local_250 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_288._0_8_,(long)local_288.m_pixels.m_ptr + local_288._0_8_);
  local_238 = 0;
  local_1c0._0_4_ = local_260._0_4_;
  local_1b8._M_p = local_1b0 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_258,local_250._M_allocated_capacity + (long)local_258);
  local_198 = local_238;
  local_190._M_allocated_capacity = 8;
  local_190._8_4_ = 4;
  local_190._12_4_ = 4;
  local_180 = R;
  local_178 = &local_208;
  local_268 = iVar4;
  if (local_258 != (void *)((long)&local_250 + 8)) {
    operator_delete(local_258,local_250._8_8_ + 1);
  }
  pUVar3 = local_220;
  if ((undefined8 *)local_288._0_8_ != puVar2) {
    operator_delete((void *)local_288._0_8_,local_288.m_pixels.m_cap + 1);
  }
  local_260 = (undefined1  [8])0x600000000;
  local_258 = (void *)CONCAT44(local_258._4_4_,INDEXTYPE_UINT16);
  local_250._M_allocated_capacity = (size_type)&local_218;
  glu::draw(((pUVar3->super_TestCase).m_context)->m_renderCtx,(local_228->m_program).m_program,1,
            (VertexArrayBinding *)local_1c0,(PrimitiveList *)local_260,(DrawUtilCallback *)0x0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                  ,0x75d);
  if (local_1b8._M_p != local_1b0 + 8) {
    operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
  }
  tcu::Surface::Surface(&local_288,iVar8,iVar9);
  context = ((pUVar3->super_TestCase).m_context)->m_renderCtx;
  local_208._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_288.m_pixels.m_cap != (void *)0x0) {
    local_288.m_pixels.m_cap = (size_t)local_288.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1c0,(TextureFormat *)&local_208,local_288.m_width,
             local_288.m_height,1,(void *)local_288.m_pixels.m_cap);
  glu::readPixels(context,local_268,local_264,(PixelBufferAccess *)local_1c0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Reading pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                  ,0x766);
  if (local_288.m_height < 1) {
    iVar4 = 0;
  }
  else {
    iVar8 = 0;
    iVar9 = 0;
    iVar4 = 0;
    do {
      uVar10 = local_288._0_8_ & 0xffffffff;
      iVar11 = iVar8;
      if (0 < local_288.m_width) {
        do {
          iVar4 = iVar4 + (uint)(*(int *)((long)local_288.m_pixels.m_ptr + (long)iVar11 * 4) != -1);
          iVar11 = iVar11 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      iVar9 = iVar9 + 1;
      iVar8 = iVar8 + local_288.m_width;
    } while (iVar9 != local_288.m_height);
    if (0 < iVar4) {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Image","");
      local_260 = (undefined1  [8])&local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Rendered image","");
      tcu::LogImage::LogImage
                ((LogImage *)local_1c0,&local_208,(string *)local_260,&local_288,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c0,local_230.order,__buf,(size_t)__n);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._16_8_ != &local_190) {
        operator_delete((void *)local_1b0._16_8_,local_190._M_allocated_capacity + 1);
      }
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0,local_1b0._0_8_ + 1);
      }
      if (local_260 != (undefined1  [8])&local_250) {
        operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      local_1c0._0_4_ = local_230.order;
      local_1c0._4_4_ = local_230.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8,"Image comparison failed, got ",0x1d);
      std::ostream::operator<<((ostringstream *)&local_1b8,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8," non-white pixels",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
      std::ios_base::~ios_base(local_148);
      iVar4 = 1;
    }
  }
  tcu::Surface::~Surface(&local_288);
  return iVar4 == 0;
}

Assistant:

bool UniformBlockCase::render(glu::ShaderProgram& program) const
{
	tcu::TestLog&			 log = m_testCtx.getLog();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	de::Random				 rnd(deStringHash(getName()));
	const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
	const int				 viewportW	= de::min(renderTarget.getWidth(), 128);
	const int				 viewportH	= de::min(renderTarget.getHeight(), 128);
	const int				 viewportX	= rnd.getInt(0, renderTarget.getWidth() - viewportW);
	const int				 viewportY	= rnd.getInt(0, renderTarget.getHeight() - viewportH);

	// Draw
	{
		const float position[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, +1.0f, 0.0f, 1.0f,
								   +1.0f, -1.0f, 0.0f, 1.0f, +1.0f, +1.0f, 0.0f, 1.0f };
		const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		gl.viewport(viewportX, viewportY, viewportW, viewportH);

		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	// Verify that all pixels are white.
	{
		tcu::Surface pixels(viewportW, viewportH);
		int			 numFailedPixels = 0;

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, pixels.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

		for (int y = 0; y < pixels.getHeight(); y++)
		{
			for (int x = 0; x < pixels.getWidth(); x++)
			{
				if (pixels.getPixel(x, y) != tcu::RGBA::white())
					numFailedPixels += 1;
			}
		}

		if (numFailedPixels > 0)
		{
			log << TestLog::Image("Image", "Rendered image", pixels);
			log << TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels"
				<< TestLog::EndMessage;
		}

		return numFailedPixels == 0;
	}
}